

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall
helics::CoreBroker::sendFedErrorAck(CoreBroker *this,ActionMessage *command,int32_t errorCode)

{
  route_id rVar1;
  string_view name;
  ActionMessage badInit;
  
  ActionMessage::ActionMessage(&badInit,cmd_fed_ack);
  badInit.flags._0_1_ = (byte)badInit.flags | 0x10;
  badInit.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
  name._M_str = (char *)(command->payload).heap;
  name._M_len = (command->payload).bufferSize;
  badInit.messageID = errorCode;
  ActionMessage::name(&badInit,name);
  rVar1 = getRoute(this,(GlobalFederateId)(command->source_id).gid);
  (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)rVar1.rid,&badInit);
  ActionMessage::~ActionMessage(&badInit);
  return;
}

Assistant:

void CoreBroker::sendFedErrorAck(ActionMessage& command, std::int32_t errorCode)
{
    ActionMessage badInit(CMD_FED_ACK);
    setActionFlag(badInit, error_flag);
    badInit.source_id = global_broker_id_local;
    badInit.messageID = errorCode;
    badInit.name(command.name());
    transmit(getRoute(command.source_id), badInit);
}